

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int __thiscall
s2pred::TriageCompareCosDistances<long_double>
          (s2pred *this,Vector3<long_double> *x,Vector3<long_double> *a,Vector3<long_double> *b)

{
  uint uVar1;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble local_38;
  longdouble local_28;
  
  GetCosDistance((longdouble *)x,(Vector3_ld *)this,(Vector3_ld *)&stack0xffffffffffffffd8,
                 (longdouble *)b);
  GetCosDistance((longdouble *)a,(Vector3_ld *)this,(Vector3_ld *)&local_38,(longdouble *)b);
  uVar1 = 0xffffffff;
  if (in_ST0 - in_ST1 <= local_38 + local_28) {
    uVar1 = (uint)(in_ST0 - in_ST1 < -(local_38 + local_28));
  }
  return uVar1;
}

Assistant:

int TriageCompareCosDistances(const Vector3<T>& x,
                              const Vector3<T>& a, const Vector3<T>& b) {
  T cos_ax_error, cos_bx_error;
  T cos_ax = GetCosDistance(a, x, &cos_ax_error);
  T cos_bx = GetCosDistance(b, x, &cos_bx_error);
  T diff = cos_ax - cos_bx;
  T error = cos_ax_error + cos_bx_error;
  return (diff > error) ? -1 : (diff < -error) ? 1 : 0;
}